

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O1

int __thiscall ncnn::LSTM_x86_avx512::create_pipeline_int8(LSTM_x86_avx512 *this,Option *opt)

{
  Mat *weight_xc;
  Mat *weight_xc_int8_scales;
  Mat *weight_hc;
  Mat *weight_hc_int8_scales;
  Mat *bias_c;
  long lVar1;
  long lVar2;
  uint _w;
  int num_output;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  int *piVar13;
  void *pvVar14;
  Allocator *pAVar15;
  int iVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  void *pvVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  uint _c;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 *puVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  void *pvVar46;
  undefined8 *puVar47;
  void *pvVar48;
  void *pvVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  void *pvVar56;
  uint uVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  void *pvVar61;
  long lVar62;
  long lVar63;
  undefined1 *puVar64;
  undefined1 *puVar65;
  ulong uVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  undefined8 *puVar70;
  undefined8 *puVar71;
  uint uVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  void *pvVar76;
  long lVar77;
  void *pvVar78;
  void *pvVar79;
  void *pvVar80;
  ulong uVar81;
  long lVar82;
  void *pvVar83;
  void *pvVar84;
  void *pvVar85;
  void *pvVar86;
  void *pvVar87;
  long lVar88;
  long lVar89;
  void *pvVar90;
  void *pvVar91;
  void *pvVar92;
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  void *local_528;
  void *local_520;
  void *local_518;
  void *local_510;
  void *local_508;
  void *local_500;
  void *local_4f8;
  void *local_4f0;
  void *local_4e8;
  void *local_4e0;
  void *local_4d8;
  void *local_4c8;
  void *local_4c0;
  void *local_4b8;
  void *local_4b0;
  void *local_4a0;
  void *local_498;
  void *local_490;
  void *local_488;
  void *local_480;
  void *local_478;
  void *local_470;
  void *local_458;
  long local_450;
  long local_438;
  long local_430;
  undefined8 *local_428;
  void *local_420;
  void *local_400;
  void *local_3f8;
  void *local_3f0;
  long local_3e8;
  void *local_3c0;
  void *local_3b8;
  void *local_3b0;
  void *local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  void *local_350;
  void *local_348;
  void *local_340;
  void *local_338;
  void *local_330;
  void *local_328;
  void *local_320;
  void *local_318;
  void *local_310;
  void *local_300;
  void *local_2f8;
  void *local_2f0;
  void *local_2b8;
  void *local_2b0;
  long local_260;
  long local_258;
  long local_250;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  
  _c = ((this->super_LSTM).direction == 2) + 1;
  uVar24 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
  _w = (this->super_LSTM).hidden_size;
  lVar52 = (long)(int)_w;
  uVar32 = (ulong)_w;
  iVar16 = (int)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) /
                (long)(int)_w);
  iVar21 = iVar16 + 3;
  if (-1 < iVar16) {
    iVar21 = iVar16;
  }
  iVar21 = iVar21 >> 2;
  weight_xc = &(this->super_LSTM).weight_xc_data;
  weight_xc_int8_scales = &(this->super_LSTM).weight_xc_data_int8_scales;
  weight_hc = &(this->super_LSTM).weight_hc_data;
  weight_hc_int8_scales = &(this->super_LSTM).weight_hc_data_int8_scales;
  bias_c = &(this->super_LSTM).bias_c_data;
  num_output = (this->super_LSTM).num_output;
  lVar23 = (long)num_output;
  iVar22 = cpu_support_x86_avx512_vnni();
  if (iVar22 == 0) {
    uVar57 = _w + 3;
    if (-1 < (int)_w) {
      uVar57 = _w;
    }
    iVar22 = _w + ((int)uVar57 >> 2) * -3;
    Mat::create(&this->weight_data_tm,num_output + iVar21,iVar22,_c,0x10,0x10,(Allocator *)0x0);
    Mat::create(&this->weight_data_tm_int8_descales,0x20,iVar22,_c,4,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,_w,1,_c,0x10,4,(Allocator *)0x0);
    uVar66 = 0;
    uVar24 = (ulong)(_w * 2);
    uVar33 = (ulong)(_w * 3);
    lVar35 = (long)(int)(_w * 2);
    lVar53 = (long)(int)(_w * 3);
    lVar82 = (long)iVar21;
    auVar93 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    do {
      lVar50 = (this->super_LSTM).weight_xc_data.cstep * uVar66;
      sVar3 = (this->super_LSTM).weight_xc_data.elemsize;
      lVar25 = (this->super_LSTM).weight_hc_data.cstep * uVar66;
      sVar4 = (this->super_LSTM).weight_hc_data.elemsize;
      sVar5 = (this->super_LSTM).bias_c_data.elemsize;
      lVar67 = (this->super_LSTM).bias_c_data.cstep * uVar66 * sVar5;
      pvVar6 = (this->super_LSTM).bias_c_data.data;
      lVar45 = (long)(this->super_LSTM).weight_xc_data_int8_scales.w * uVar66 *
               (this->super_LSTM).weight_xc_data_int8_scales.elemsize;
      pvVar7 = (this->super_LSTM).weight_xc_data_int8_scales.data;
      lVar77 = (long)(this->super_LSTM).weight_hc_data_int8_scales.w * uVar66 *
               (this->super_LSTM).weight_hc_data_int8_scales.elemsize;
      pvVar8 = (this->super_LSTM).weight_hc_data_int8_scales.data;
      pvVar9 = (this->weight_data_tm).data;
      lVar88 = (this->weight_data_tm).cstep * uVar66;
      sVar10 = (this->weight_data_tm).elemsize;
      lVar89 = lVar88 * sVar10;
      lVar36 = (long)(this->super_LSTM).bias_c_data.w * sVar5;
      local_428 = (undefined8 *)
                  ((this->bias_c_data_packed).cstep * uVar66 * (this->bias_c_data_packed).elemsize +
                  (long)(this->bias_c_data_packed).data);
      sVar5 = (this->weight_data_tm_int8_descales).elemsize;
      lVar54 = (this->weight_data_tm_int8_descales).cstep * uVar66 * sVar5;
      pvVar11 = (this->weight_data_tm_int8_descales).data;
      lVar18 = lVar36 * 3 + lVar67;
      lVar19 = lVar36 + lVar67;
      lVar36 = lVar36 * 2 + lVar67;
      pvVar49 = (this->super_LSTM).weight_xc_data.data;
      pvVar14 = (void *)((long)pvVar49 + lVar50 * sVar3);
      pvVar12 = (this->super_LSTM).weight_hc_data.data;
      pvVar86 = (void *)(lVar25 * sVar4 + (long)pvVar12);
      lVar68 = (long)(this->super_LSTM).weight_xc_data.w;
      lVar37 = (long)(this->super_LSTM).weight_hc_data.w;
      lVar38 = (long)(this->weight_data_tm).w;
      lVar58 = (long)(this->weight_data_tm_int8_descales).w;
      if ((int)_w < 4) {
        local_4f0 = (void *)0x0;
      }
      else {
        lVar26 = sVar3 * lVar68;
        lVar27 = sVar4 * lVar37;
        lVar39 = ((uVar33 + 3) * lVar68 + lVar50) * sVar3;
        lVar55 = ((uVar24 + 3) * lVar68 + lVar50) * sVar3;
        pvVar28 = (void *)(((uVar32 + 3) * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_2f0 = (void *)((lVar68 * 3 + lVar50) * sVar3 + (long)pvVar49);
        lVar59 = ((uVar33 + 2) * lVar68 + lVar50) * sVar3;
        lVar63 = ((uVar24 + 2) * lVar68 + lVar50) * sVar3;
        local_2f8 = (void *)(((uVar32 + 2) * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        pvVar46 = (void *)((lVar68 * 2 + lVar50) * sVar3 + (long)pvVar49);
        local_310 = (void *)(((uVar33 + 1) * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_318 = (void *)(((uVar24 + 1) * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        pvVar78 = (void *)(((uVar32 + 1) * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_3b0 = (void *)((lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_300 = (void *)((uVar33 * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_320 = (void *)((uVar24 * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        pvVar83 = (void *)((uVar32 * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_f8 = (long)pvVar49 + lVar50 * sVar3 + 1;
        pvVar80 = (void *)((long)pvVar49 + lVar63);
        local_100 = (long)pvVar49 + lVar63 + 1;
        pvVar76 = (void *)((long)pvVar49 + lVar55);
        local_108 = (long)pvVar49 + lVar55 + 1;
        local_328 = (void *)((long)pvVar49 + lVar59);
        local_110 = (long)pvVar49 + lVar59 + 1;
        local_498 = (void *)((long)pvVar49 + lVar39);
        local_118 = (long)pvVar49 + lVar39 + 1;
        lVar39 = ((uVar33 + 3) * lVar37 + lVar25) * sVar4;
        lVar55 = ((uVar24 + 3) * lVar37 + lVar25) * sVar4;
        local_490 = (void *)(((uVar32 + 3) * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_400 = (void *)((lVar37 * 3 + lVar25) * sVar4 + (long)pvVar12);
        lVar59 = ((uVar33 + 2) * lVar37 + lVar25) * sVar4;
        lVar63 = ((uVar24 + 2) * lVar37 + lVar25) * sVar4;
        local_3a8 = (void *)(((uVar32 + 2) * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_420 = (void *)((lVar25 + lVar37 * 2) * sVar4 + (long)pvVar12);
        local_480 = (void *)(((uVar33 + 1) * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_3b8 = (void *)(((uVar24 + 1) * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_330 = (void *)(((uVar32 + 1) * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_338 = (void *)((lVar25 + lVar37) * sVar4 + (long)pvVar12);
        local_2b0 = (void *)((uVar33 * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_2b8 = (void *)((uVar24 * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_340 = (void *)((uVar32 * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_120 = (long)pvVar12 + lVar25 * sVar4 + 1;
        pvVar48 = (void *)((long)pvVar12 + lVar63);
        local_128 = (long)pvVar12 + lVar63 + 1;
        pvVar61 = (void *)((long)pvVar12 + lVar55);
        local_130 = (long)pvVar12 + lVar55 + 1;
        pvVar56 = (void *)((long)pvVar12 + lVar59);
        local_138 = (long)pvVar12 + lVar59 + 1;
        local_3f0 = (void *)((long)pvVar12 + lVar39);
        local_140 = (long)pvVar12 + lVar39 + 1;
        lVar39 = lVar26 * 4;
        lVar55 = lVar27 * 4;
        puVar70 = local_428;
        uVar81 = 0;
        local_350 = pvVar14;
        local_348 = pvVar86;
        do {
          puVar47 = (undefined8 *)((long)pvVar9 + sVar10 * lVar38 * (uVar81 >> 2) + lVar89);
          uVar30 = 0;
          puVar71 = (undefined8 *)((long)pvVar6 + uVar81 * 4 + lVar67);
          uVar17 = puVar71[1];
          *puVar70 = *puVar71;
          puVar70[1] = uVar17;
          puVar71 = (undefined8 *)((long)pvVar6 + uVar81 * 4 + lVar19);
          uVar17 = puVar71[1];
          puVar70[2] = *puVar71;
          puVar70[3] = uVar17;
          puVar71 = (undefined8 *)((long)pvVar6 + uVar81 * 4 + lVar36);
          uVar17 = puVar71[1];
          puVar70[4] = *puVar71;
          puVar70[5] = uVar17;
          puVar71 = (undefined8 *)((long)pvVar6 + uVar81 * 4 + lVar18);
          uVar17 = puVar71[1];
          puVar70[6] = *puVar71;
          puVar70[7] = uVar17;
          if (0x1f < iVar16) {
            lVar59 = 7;
            do {
              *puVar47 = *(undefined8 *)((long)local_350 + lVar59 + -7);
              puVar47[1] = *(undefined8 *)((long)pvVar83 + lVar59 + -7);
              puVar47[2] = *(undefined8 *)((long)local_320 + lVar59 + -7);
              puVar47[3] = *(undefined8 *)((long)local_300 + lVar59 + -7);
              puVar47[4] = *(undefined8 *)((long)local_3b0 + lVar59 + -7);
              puVar47[5] = *(undefined8 *)((long)pvVar78 + lVar59 + -7);
              puVar47[6] = *(undefined8 *)((long)local_318 + lVar59 + -7);
              puVar47[7] = *(undefined8 *)((long)local_310 + lVar59 + -7);
              puVar47[8] = *(undefined8 *)((long)pvVar46 + lVar59 + -7);
              puVar47[9] = *(undefined8 *)((long)local_2f8 + lVar59 + -7);
              puVar47[10] = *(undefined8 *)((long)pvVar80 + lVar59 + -7);
              puVar47[0xb] = *(undefined8 *)((long)local_328 + lVar59 + -7);
              puVar47[0xc] = *(undefined8 *)((long)local_2f0 + lVar59 + -7);
              puVar47[0xd] = *(undefined8 *)((long)pvVar28 + lVar59 + -7);
              puVar47[0xe] = *(undefined8 *)((long)pvVar76 + lVar59 + -7);
              puVar47[0xf] = *(undefined8 *)((long)local_498 + lVar59 + -7);
              puVar47 = puVar47 + 0x10;
              lVar59 = lVar59 + 8;
            } while (lVar59 < lVar82);
            uVar30 = (ulong)((int)lVar59 - 7);
          }
          uVar57 = (uint)uVar30;
          if ((int)(uVar57 | 3) < iVar21) {
            local_518 = (void *)local_118;
            local_510 = (void *)local_110;
            local_4d8 = (void *)local_108;
            local_520 = local_320;
            local_4c8 = local_318;
            local_4e0 = local_300;
            local_4e8 = local_310;
            local_4f0 = local_2f0;
            local_4f8 = local_2f8;
            local_500 = (void *)local_100;
            iVar22 = 0;
            lVar59 = local_f8;
            pvVar79 = local_3b0;
            pvVar84 = pvVar78;
            pvVar91 = pvVar46;
            pvVar92 = pvVar83;
            local_508 = pvVar28;
            do {
              *(undefined1 *)puVar47 = *(undefined1 *)(lVar59 + -1 + uVar30);
              *(undefined1 *)((long)puVar47 + 1) = *(undefined1 *)(lVar59 + uVar30);
              *(undefined1 *)((long)puVar47 + 2) = *(undefined1 *)(lVar59 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 3) = *(undefined1 *)(lVar59 + 2 + uVar30);
              *(undefined1 *)((long)puVar47 + 4) = *(undefined1 *)((long)pvVar79 + uVar30);
              *(undefined1 *)((long)puVar47 + 5) = *(undefined1 *)((long)pvVar79 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 6) = *(undefined1 *)((long)pvVar79 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 7) = *(undefined1 *)((long)pvVar79 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 1) = *(undefined1 *)((long)pvVar92 + uVar30);
              *(undefined1 *)((long)puVar47 + 9) = *(undefined1 *)((long)pvVar92 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 10) = *(undefined1 *)((long)pvVar92 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0xb) = *(undefined1 *)((long)pvVar92 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0xc) = *(undefined1 *)((long)pvVar84 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xd) = *(undefined1 *)((long)pvVar84 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0xe) = *(undefined1 *)((long)pvVar84 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0xf) = *(undefined1 *)((long)pvVar84 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 2) = *(undefined1 *)((long)local_520 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x11) = *(undefined1 *)((long)local_520 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x12) = *(undefined1 *)((long)local_520 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x13) = *(undefined1 *)((long)local_520 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x14) = *(undefined1 *)((long)local_4c8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x15) = *(undefined1 *)((long)local_4c8 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x16) = *(undefined1 *)((long)local_4c8 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x17) = *(undefined1 *)((long)local_4c8 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 3) = *(undefined1 *)((long)local_4e0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x19) = *(undefined1 *)((long)local_4e0 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x1a) = *(undefined1 *)((long)local_4e0 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x1b) = *(undefined1 *)((long)local_4e0 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x1c) = *(undefined1 *)((long)local_4e8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1d) = *(undefined1 *)((long)local_4e8 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x1e) = *(undefined1 *)((long)local_4e8 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x1f) = *(undefined1 *)((long)local_4e8 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 4) = *(undefined1 *)((long)pvVar91 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x21) = *(undefined1 *)((long)pvVar91 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x22) = *(undefined1 *)((long)pvVar91 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x23) = *(undefined1 *)((long)pvVar91 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x24) = *(undefined1 *)((long)local_4f0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x25) = *(undefined1 *)((long)local_4f0 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x26) = *(undefined1 *)((long)local_4f0 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x27) = *(undefined1 *)((long)local_4f0 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 5) = *(undefined1 *)((long)local_4f8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x29) = *(undefined1 *)((long)local_4f8 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x2a) = *(undefined1 *)((long)local_4f8 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x2b) = *(undefined1 *)((long)local_4f8 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x2c) = *(undefined1 *)((long)local_508 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x2d) = *(undefined1 *)((long)local_508 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x2e) = *(undefined1 *)((long)local_508 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x2f) = *(undefined1 *)((long)local_508 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 6) = *(undefined1 *)((long)local_500 + -1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x31) = *(undefined1 *)((long)local_500 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x32) = *(undefined1 *)((long)local_500 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x33) = *(undefined1 *)((long)local_500 + 2 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x34) = *(undefined1 *)((long)local_4d8 + -1 + uVar30)
              ;
              *(undefined1 *)((long)puVar47 + 0x35) = *(undefined1 *)((long)local_4d8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x36) = *(undefined1 *)((long)local_4d8 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x37) = *(undefined1 *)((long)local_4d8 + 2 + uVar30);
              *(undefined1 *)(puVar47 + 7) = *(undefined1 *)((long)local_510 + -1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x39) = *(undefined1 *)((long)local_510 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3a) = *(undefined1 *)((long)local_510 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3b) = *(undefined1 *)((long)local_510 + 2 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3c) = *(undefined1 *)((long)local_518 + -1 + uVar30)
              ;
              *(undefined1 *)((long)puVar47 + 0x3d) = *(undefined1 *)((long)local_518 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3e) = *(undefined1 *)((long)local_518 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3f) = *(undefined1 *)((long)local_518 + 2 + uVar30);
              puVar47 = puVar47 + 8;
              iVar51 = uVar57 + iVar22;
              iVar22 = iVar22 + 4;
              lVar59 = lVar59 + 4;
              local_500 = (void *)((long)local_500 + 4);
              local_508 = (void *)((long)local_508 + 4);
              local_4f8 = (void *)((long)local_4f8 + 4);
              local_4f0 = (void *)((long)local_4f0 + 4);
              pvVar91 = (void *)((long)pvVar91 + 4);
              local_4e8 = (void *)((long)local_4e8 + 4);
              local_4e0 = (void *)((long)local_4e0 + 4);
              local_4c8 = (void *)((long)local_4c8 + 4);
              local_520 = (void *)((long)local_520 + 4);
              pvVar84 = (void *)((long)pvVar84 + 4);
              pvVar92 = (void *)((long)pvVar92 + 4);
              pvVar79 = (void *)((long)pvVar79 + 4);
              local_4d8 = (void *)((long)local_4d8 + 4);
              local_510 = (void *)((long)local_510 + 4);
              local_518 = (void *)((long)local_518 + 4);
            } while ((int)(iVar51 + 4U | 3) < iVar21);
            uVar30 = (ulong)(uVar57 + iVar22);
          }
          lVar73 = uVar81 + uVar32 + 1;
          lVar59 = uVar81 + 1 + uVar24;
          lVar74 = uVar81 + uVar33 + 1;
          lVar75 = uVar81 + uVar32 + 2;
          lVar63 = uVar81 + 2 + uVar24;
          lVar62 = uVar81 + 2 + uVar33;
          lVar69 = uVar81 + 3 + uVar32;
          lVar34 = uVar24 + uVar81 + 3;
          uVar57 = (uint)uVar30;
          uVar72 = uVar57 | 1;
          lVar40 = uVar33 + uVar81 + 3;
          if ((int)uVar72 < iVar21) {
            local_518 = local_2f8;
            local_4d8 = local_320;
            local_4c8 = local_318;
            local_4f0 = local_300;
            local_4f8 = local_310;
            local_508 = local_498;
            iVar22 = 0;
            pvVar79 = local_3b0;
            pvVar84 = pvVar78;
            pvVar91 = local_2f0;
            pvVar92 = local_328;
            pvVar85 = pvVar83;
            pvVar87 = pvVar46;
            pvVar90 = local_350;
            local_510 = pvVar28;
            local_4e8 = pvVar76;
            local_4e0 = pvVar80;
            do {
              *(undefined1 *)puVar47 = *(undefined1 *)((long)pvVar90 + uVar30);
              uVar29 = (ulong)uVar72;
              *(undefined1 *)((long)puVar47 + 1) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + uVar81 * lVar26);
              *(undefined1 *)((long)puVar47 + 2) = *(undefined1 *)((long)pvVar79 + uVar30);
              *(undefined1 *)((long)puVar47 + 3) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + (uVar81 | 1) * lVar26);
              *(undefined1 *)((long)puVar47 + 4) = *(undefined1 *)((long)pvVar87 + uVar30);
              *(undefined1 *)((long)puVar47 + 5) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + (uVar81 | 2) * lVar26);
              *(undefined1 *)((long)puVar47 + 6) = *(undefined1 *)((long)pvVar91 + uVar30);
              *(undefined1 *)((long)puVar47 + 7) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + (uVar81 | 3) * lVar26);
              *(undefined1 *)(puVar47 + 1) = *(undefined1 *)((long)pvVar85 + uVar30);
              *(undefined1 *)((long)puVar47 + 9) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + (uVar81 + uVar32) * lVar26);
              *(undefined1 *)((long)puVar47 + 10) = *(undefined1 *)((long)pvVar84 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xb) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar73 * lVar26);
              *(undefined1 *)((long)puVar47 + 0xc) = *(undefined1 *)((long)local_518 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xd) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar75 * lVar26);
              *(undefined1 *)((long)puVar47 + 0xe) = *(undefined1 *)((long)local_510 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xf) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar69 * lVar26);
              *(undefined1 *)(puVar47 + 2) = *(undefined1 *)((long)local_4d8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x11) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + (uVar81 + uVar24) * lVar26);
              *(undefined1 *)((long)puVar47 + 0x12) = *(undefined1 *)((long)local_4c8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x13) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar59 * lVar26);
              *(undefined1 *)((long)puVar47 + 0x14) = *(undefined1 *)((long)local_4e0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x15) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar63 * lVar26);
              *(undefined1 *)((long)puVar47 + 0x16) = *(undefined1 *)((long)local_4e8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x17) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar34 * lVar26);
              *(undefined1 *)(puVar47 + 3) = *(undefined1 *)((long)local_4f0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x19) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + (uVar81 + uVar33) * lVar26);
              *(undefined1 *)((long)puVar47 + 0x1a) = *(undefined1 *)((long)local_4f8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1b) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar74 * lVar26);
              *(undefined1 *)((long)puVar47 + 0x1c) = *(undefined1 *)((long)pvVar92 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1d) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar62 * lVar26);
              *(undefined1 *)((long)puVar47 + 0x1e) = *(undefined1 *)((long)local_508 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1f) =
                   *(undefined1 *)((long)pvVar14 + uVar29 + lVar40 * lVar26);
              puVar47 = puVar47 + 4;
              uVar72 = uVar57 + iVar22 + 2 | 1;
              iVar22 = iVar22 + 2;
              local_508 = (void *)((long)local_508 + 2);
              pvVar92 = (void *)((long)pvVar92 + 2);
              local_4f8 = (void *)((long)local_4f8 + 2);
              local_4f0 = (void *)((long)local_4f0 + 2);
              local_4e8 = (void *)((long)local_4e8 + 2);
              local_4e0 = (void *)((long)local_4e0 + 2);
              local_4c8 = (void *)((long)local_4c8 + 2);
              local_4d8 = (void *)((long)local_4d8 + 2);
              local_510 = (void *)((long)local_510 + 2);
              local_518 = (void *)((long)local_518 + 2);
              pvVar84 = (void *)((long)pvVar84 + 2);
              pvVar85 = (void *)((long)pvVar85 + 2);
              pvVar91 = (void *)((long)pvVar91 + 2);
              pvVar87 = (void *)((long)pvVar87 + 2);
              pvVar79 = (void *)((long)pvVar79 + 2);
              pvVar90 = (void *)((long)pvVar90 + 2);
            } while ((int)uVar72 < iVar21);
            uVar30 = (ulong)(uVar57 + iVar22);
          }
          if ((int)uVar30 < iVar21) {
            local_520 = local_2f0;
            local_510 = local_2f8;
            local_4c8 = local_320;
            local_4e0 = local_318;
            local_4f8 = local_300;
            local_508 = local_310;
            local_500 = local_328;
            local_4c0 = local_498;
            iVar22 = 0;
            pvVar79 = local_350;
            pvVar84 = pvVar46;
            pvVar91 = local_3b0;
            local_528 = pvVar83;
            local_518 = pvVar78;
            local_4f0 = pvVar76;
            local_4e8 = pvVar80;
            local_4d8 = pvVar28;
            do {
              *(undefined1 *)puVar47 = *(undefined1 *)((long)pvVar79 + uVar30);
              *(undefined1 *)((long)puVar47 + 1) = *(undefined1 *)((long)pvVar91 + uVar30);
              *(undefined1 *)((long)puVar47 + 2) = *(undefined1 *)((long)pvVar84 + uVar30);
              *(undefined1 *)((long)puVar47 + 3) = *(undefined1 *)((long)local_520 + uVar30);
              *(undefined1 *)((long)puVar47 + 4) = *(undefined1 *)((long)local_528 + uVar30);
              *(undefined1 *)((long)puVar47 + 5) = *(undefined1 *)((long)local_518 + uVar30);
              *(undefined1 *)((long)puVar47 + 6) = *(undefined1 *)((long)local_510 + uVar30);
              *(undefined1 *)((long)puVar47 + 7) = *(undefined1 *)((long)local_4d8 + uVar30);
              *(undefined1 *)(puVar47 + 1) = *(undefined1 *)((long)local_4c8 + uVar30);
              *(undefined1 *)((long)puVar47 + 9) = *(undefined1 *)((long)local_4e0 + uVar30);
              *(undefined1 *)((long)puVar47 + 10) = *(undefined1 *)((long)local_4e8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xb) = *(undefined1 *)((long)local_4f0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xc) = *(undefined1 *)((long)local_4f8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xd) = *(undefined1 *)((long)local_508 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xe) = *(undefined1 *)((long)local_500 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xf) = *(undefined1 *)((long)local_4c0 + uVar30);
              puVar47 = puVar47 + 2;
              iVar22 = iVar22 + 1;
              local_4c0 = (void *)((long)local_4c0 + 1);
              local_500 = (void *)((long)local_500 + 1);
              local_508 = (void *)((long)local_508 + 1);
              local_4f8 = (void *)((long)local_4f8 + 1);
              local_4f0 = (void *)((long)local_4f0 + 1);
              local_4e8 = (void *)((long)local_4e8 + 1);
              local_4e0 = (void *)((long)local_4e0 + 1);
              local_4c8 = (void *)((long)local_4c8 + 1);
              local_4d8 = (void *)((long)local_4d8 + 1);
              local_510 = (void *)((long)local_510 + 1);
              local_518 = (void *)((long)local_518 + 1);
              local_528 = (void *)((long)local_528 + 1);
              local_520 = (void *)((long)local_520 + 1);
              pvVar84 = (void *)((long)pvVar84 + 1);
              pvVar91 = (void *)((long)pvVar91 + 1);
              pvVar79 = (void *)((long)pvVar79 + 1);
            } while (iVar22 + (int)uVar30 < iVar21);
          }
          uVar57 = 0;
          if (7 < num_output) {
            lVar60 = 7;
            do {
              *puVar47 = *(undefined8 *)((long)local_348 + lVar60 + -7);
              puVar47[1] = *(undefined8 *)((long)local_340 + lVar60 + -7);
              puVar47[2] = *(undefined8 *)((long)local_2b8 + lVar60 + -7);
              puVar47[3] = *(undefined8 *)((long)local_2b0 + lVar60 + -7);
              puVar47[4] = *(undefined8 *)((long)local_338 + lVar60 + -7);
              puVar47[5] = *(undefined8 *)((long)local_330 + lVar60 + -7);
              puVar47[6] = *(undefined8 *)((long)local_3b8 + lVar60 + -7);
              puVar47[7] = *(undefined8 *)((long)local_480 + lVar60 + -7);
              puVar47[8] = *(undefined8 *)((long)local_420 + lVar60 + -7);
              puVar47[9] = *(undefined8 *)((long)local_3a8 + lVar60 + -7);
              puVar47[10] = *(undefined8 *)((long)pvVar48 + lVar60 + -7);
              puVar47[0xb] = *(undefined8 *)((long)pvVar56 + lVar60 + -7);
              puVar47[0xc] = *(undefined8 *)((long)local_400 + lVar60 + -7);
              puVar47[0xd] = *(undefined8 *)((long)local_490 + lVar60 + -7);
              puVar47[0xe] = *(undefined8 *)((long)pvVar61 + lVar60 + -7);
              puVar47[0xf] = *(undefined8 *)((long)local_3f0 + lVar60 + -7);
              puVar47 = puVar47 + 0x10;
              lVar60 = lVar60 + 8;
            } while (lVar60 < lVar23);
            uVar57 = (int)lVar60 - 7;
          }
          if ((int)(uVar57 | 3) < num_output) {
            uVar30 = (ulong)uVar57;
            local_4d8 = (void *)local_140;
            local_4c8 = (void *)local_138;
            local_4e0 = (void *)local_130;
            local_520 = local_340;
            local_528 = local_330;
            local_518 = local_2b8;
            local_4e8 = local_2b0;
            local_4f0 = local_420;
            local_4f8 = local_400;
            local_508 = local_3a8;
            local_500 = local_490;
            local_4c0 = (void *)local_128;
            iVar22 = 0;
            pvVar79 = local_338;
            pvVar84 = local_480;
            lVar60 = local_120;
            pvVar91 = local_3b8;
            do {
              *(undefined1 *)puVar47 = *(undefined1 *)(lVar60 + -1 + uVar30);
              *(undefined1 *)((long)puVar47 + 1) = *(undefined1 *)(lVar60 + uVar30);
              *(undefined1 *)((long)puVar47 + 2) = *(undefined1 *)(lVar60 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 3) = *(undefined1 *)(lVar60 + 2 + uVar30);
              *(undefined1 *)((long)puVar47 + 4) = *(undefined1 *)((long)pvVar79 + uVar30);
              *(undefined1 *)((long)puVar47 + 5) = *(undefined1 *)((long)pvVar79 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 6) = *(undefined1 *)((long)pvVar79 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 7) = *(undefined1 *)((long)pvVar79 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 1) = *(undefined1 *)((long)local_520 + uVar30);
              *(undefined1 *)((long)puVar47 + 9) = *(undefined1 *)((long)local_520 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 10) = *(undefined1 *)((long)local_520 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0xb) = *(undefined1 *)((long)local_520 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0xc) = *(undefined1 *)((long)local_528 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xd) = *(undefined1 *)((long)local_528 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0xe) = *(undefined1 *)((long)local_528 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0xf) = *(undefined1 *)((long)local_528 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 2) = *(undefined1 *)((long)local_518 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x11) = *(undefined1 *)((long)local_518 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x12) = *(undefined1 *)((long)local_518 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x13) = *(undefined1 *)((long)local_518 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x14) = *(undefined1 *)((long)pvVar91 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x15) = *(undefined1 *)((long)pvVar91 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x16) = *(undefined1 *)((long)pvVar91 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x17) = *(undefined1 *)((long)pvVar91 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 3) = *(undefined1 *)((long)local_4e8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x19) = *(undefined1 *)((long)local_4e8 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x1a) = *(undefined1 *)((long)local_4e8 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x1b) = *(undefined1 *)((long)local_4e8 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x1c) = *(undefined1 *)((long)pvVar84 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1d) = *(undefined1 *)((long)pvVar84 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x1e) = *(undefined1 *)((long)pvVar84 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x1f) = *(undefined1 *)((long)pvVar84 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 4) = *(undefined1 *)((long)local_4f0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x21) = *(undefined1 *)((long)local_4f0 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x22) = *(undefined1 *)((long)local_4f0 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x23) = *(undefined1 *)((long)local_4f0 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x24) = *(undefined1 *)((long)local_4f8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x25) = *(undefined1 *)((long)local_4f8 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x26) = *(undefined1 *)((long)local_4f8 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x27) = *(undefined1 *)((long)local_4f8 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 5) = *(undefined1 *)((long)local_508 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x29) = *(undefined1 *)((long)local_508 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x2a) = *(undefined1 *)((long)local_508 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x2b) = *(undefined1 *)((long)local_508 + uVar30 + 3);
              *(undefined1 *)((long)puVar47 + 0x2c) = *(undefined1 *)((long)local_500 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x2d) = *(undefined1 *)((long)local_500 + uVar30 + 1);
              *(undefined1 *)((long)puVar47 + 0x2e) = *(undefined1 *)((long)local_500 + uVar30 + 2);
              *(undefined1 *)((long)puVar47 + 0x2f) = *(undefined1 *)((long)local_500 + uVar30 + 3);
              *(undefined1 *)(puVar47 + 6) = *(undefined1 *)((long)local_4c0 + -1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x31) = *(undefined1 *)((long)local_4c0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x32) = *(undefined1 *)((long)local_4c0 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x33) = *(undefined1 *)((long)local_4c0 + 2 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x34) = *(undefined1 *)((long)local_4e0 + -1 + uVar30)
              ;
              *(undefined1 *)((long)puVar47 + 0x35) = *(undefined1 *)((long)local_4e0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x36) = *(undefined1 *)((long)local_4e0 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x37) = *(undefined1 *)((long)local_4e0 + 2 + uVar30);
              *(undefined1 *)(puVar47 + 7) = *(undefined1 *)((long)local_4c8 + -1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x39) = *(undefined1 *)((long)local_4c8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3a) = *(undefined1 *)((long)local_4c8 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3b) = *(undefined1 *)((long)local_4c8 + 2 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3c) = *(undefined1 *)((long)local_4d8 + -1 + uVar30)
              ;
              *(undefined1 *)((long)puVar47 + 0x3d) = *(undefined1 *)((long)local_4d8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3e) = *(undefined1 *)((long)local_4d8 + 1 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x3f) = *(undefined1 *)((long)local_4d8 + 2 + uVar30);
              puVar47 = puVar47 + 8;
              iVar51 = uVar57 + iVar22;
              iVar22 = iVar22 + 4;
              lVar60 = lVar60 + 4;
              local_4c0 = (void *)((long)local_4c0 + 4);
              local_500 = (void *)((long)local_500 + 4);
              local_508 = (void *)((long)local_508 + 4);
              local_4f8 = (void *)((long)local_4f8 + 4);
              local_4f0 = (void *)((long)local_4f0 + 4);
              pvVar84 = (void *)((long)pvVar84 + 4);
              local_4e8 = (void *)((long)local_4e8 + 4);
              pvVar91 = (void *)((long)pvVar91 + 4);
              local_518 = (void *)((long)local_518 + 4);
              local_528 = (void *)((long)local_528 + 4);
              local_520 = (void *)((long)local_520 + 4);
              pvVar79 = (void *)((long)pvVar79 + 4);
              local_4e0 = (void *)((long)local_4e0 + 4);
              local_4c8 = (void *)((long)local_4c8 + 4);
              local_4d8 = (void *)((long)local_4d8 + 4);
            } while ((int)(iVar51 + 4U | 3) < num_output);
            uVar57 = uVar57 + iVar22;
          }
          uVar72 = uVar57 | 1;
          if ((int)uVar72 < num_output) {
            uVar30 = (ulong)uVar57;
            local_520 = local_340;
            local_528 = local_330;
            local_518 = local_3a8;
            local_510 = local_490;
            local_4d8 = local_2b8;
            local_4c8 = local_3b8;
            local_4f0 = local_2b0;
            local_4f8 = local_480;
            local_500 = local_3f0;
            iVar22 = 0;
            pvVar79 = local_348;
            pvVar84 = local_400;
            pvVar91 = local_338;
            pvVar92 = local_420;
            local_508 = pvVar56;
            local_4e8 = pvVar61;
            local_4e0 = pvVar48;
            do {
              *(undefined1 *)puVar47 = *(undefined1 *)((long)pvVar79 + uVar30);
              uVar29 = (ulong)uVar72;
              *(undefined1 *)((long)puVar47 + 1) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + uVar81 * lVar27);
              *(undefined1 *)((long)puVar47 + 2) = *(undefined1 *)((long)pvVar91 + uVar30);
              *(undefined1 *)((long)puVar47 + 3) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + (uVar81 | 1) * lVar27);
              *(undefined1 *)((long)puVar47 + 4) = *(undefined1 *)((long)pvVar92 + uVar30);
              *(undefined1 *)((long)puVar47 + 5) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + (uVar81 | 2) * lVar27);
              *(undefined1 *)((long)puVar47 + 6) = *(undefined1 *)((long)pvVar84 + uVar30);
              *(undefined1 *)((long)puVar47 + 7) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + (uVar81 | 3) * lVar27);
              *(undefined1 *)(puVar47 + 1) = *(undefined1 *)((long)local_520 + uVar30);
              *(undefined1 *)((long)puVar47 + 9) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + (uVar81 + uVar32) * lVar27);
              *(undefined1 *)((long)puVar47 + 10) = *(undefined1 *)((long)local_528 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xb) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar73 * lVar27);
              *(undefined1 *)((long)puVar47 + 0xc) = *(undefined1 *)((long)local_518 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xd) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar75 * lVar27);
              *(undefined1 *)((long)puVar47 + 0xe) = *(undefined1 *)((long)local_510 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xf) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar69 * lVar27);
              *(undefined1 *)(puVar47 + 2) = *(undefined1 *)((long)local_4d8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x11) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + (uVar81 + uVar24) * lVar27);
              *(undefined1 *)((long)puVar47 + 0x12) = *(undefined1 *)((long)local_4c8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x13) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar59 * lVar27);
              *(undefined1 *)((long)puVar47 + 0x14) = *(undefined1 *)((long)local_4e0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x15) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar63 * lVar27);
              *(undefined1 *)((long)puVar47 + 0x16) = *(undefined1 *)((long)local_4e8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x17) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar34 * lVar27);
              *(undefined1 *)(puVar47 + 3) = *(undefined1 *)((long)local_4f0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x19) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + (uVar81 + uVar33) * lVar27);
              *(undefined1 *)((long)puVar47 + 0x1a) = *(undefined1 *)((long)local_4f8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1b) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar74 * lVar27);
              *(undefined1 *)((long)puVar47 + 0x1c) = *(undefined1 *)((long)local_508 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1d) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar62 * lVar27);
              *(undefined1 *)((long)puVar47 + 0x1e) = *(undefined1 *)((long)local_500 + uVar30);
              *(undefined1 *)((long)puVar47 + 0x1f) =
                   *(undefined1 *)((long)pvVar86 + uVar29 + lVar40 * lVar27);
              puVar47 = puVar47 + 4;
              uVar72 = uVar57 + iVar22 + 2 | 1;
              iVar22 = iVar22 + 2;
              local_500 = (void *)((long)local_500 + 2);
              local_508 = (void *)((long)local_508 + 2);
              local_4f8 = (void *)((long)local_4f8 + 2);
              local_4f0 = (void *)((long)local_4f0 + 2);
              local_4e8 = (void *)((long)local_4e8 + 2);
              local_4e0 = (void *)((long)local_4e0 + 2);
              local_4c8 = (void *)((long)local_4c8 + 2);
              local_4d8 = (void *)((long)local_4d8 + 2);
              local_510 = (void *)((long)local_510 + 2);
              local_518 = (void *)((long)local_518 + 2);
              local_528 = (void *)((long)local_528 + 2);
              local_520 = (void *)((long)local_520 + 2);
              pvVar84 = (void *)((long)pvVar84 + 2);
              pvVar92 = (void *)((long)pvVar92 + 2);
              pvVar91 = (void *)((long)pvVar91 + 2);
              pvVar79 = (void *)((long)pvVar79 + 2);
            } while ((int)uVar72 < num_output);
            uVar57 = uVar57 + iVar22;
          }
          lVar59 = (uVar81 >> 2) * sVar5 * lVar58;
          if ((int)uVar57 < num_output) {
            uVar30 = (ulong)uVar57;
            local_528 = local_420;
            local_518 = local_400;
            local_510 = local_340;
            local_4d8 = local_330;
            local_4c8 = local_3a8;
            local_4e0 = local_490;
            local_4e8 = local_2b8;
            local_4f0 = local_3b8;
            local_500 = local_2b0;
            local_4c0 = local_480;
            local_4b8 = local_3f0;
            iVar22 = 0;
            pvVar79 = local_338;
            pvVar84 = local_348;
            local_508 = pvVar61;
            local_4f8 = pvVar48;
            local_4b0 = pvVar56;
            do {
              *(undefined1 *)puVar47 = *(undefined1 *)((long)pvVar84 + uVar30);
              *(undefined1 *)((long)puVar47 + 1) = *(undefined1 *)((long)pvVar79 + uVar30);
              *(undefined1 *)((long)puVar47 + 2) = *(undefined1 *)((long)local_528 + uVar30);
              *(undefined1 *)((long)puVar47 + 3) = *(undefined1 *)((long)local_518 + uVar30);
              *(undefined1 *)((long)puVar47 + 4) = *(undefined1 *)((long)local_510 + uVar30);
              *(undefined1 *)((long)puVar47 + 5) = *(undefined1 *)((long)local_4d8 + uVar30);
              *(undefined1 *)((long)puVar47 + 6) = *(undefined1 *)((long)local_4c8 + uVar30);
              *(undefined1 *)((long)puVar47 + 7) = *(undefined1 *)((long)local_4e0 + uVar30);
              *(undefined1 *)(puVar47 + 1) = *(undefined1 *)((long)local_4e8 + uVar30);
              *(undefined1 *)((long)puVar47 + 9) = *(undefined1 *)((long)local_4f0 + uVar30);
              *(undefined1 *)((long)puVar47 + 10) = *(undefined1 *)((long)local_4f8 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xb) = *(undefined1 *)((long)local_508 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xc) = *(undefined1 *)((long)local_500 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xd) = *(undefined1 *)((long)local_4c0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xe) = *(undefined1 *)((long)local_4b0 + uVar30);
              *(undefined1 *)((long)puVar47 + 0xf) = *(undefined1 *)((long)local_4b8 + uVar30);
              iVar22 = iVar22 + 1;
              local_4b8 = (void *)((long)local_4b8 + 1);
              local_4b0 = (void *)((long)local_4b0 + 1);
              local_4c0 = (void *)((long)local_4c0 + 1);
              local_500 = (void *)((long)local_500 + 1);
              local_508 = (void *)((long)local_508 + 1);
              local_4f8 = (void *)((long)local_4f8 + 1);
              local_4f0 = (void *)((long)local_4f0 + 1);
              local_4e8 = (void *)((long)local_4e8 + 1);
              local_4e0 = (void *)((long)local_4e0 + 1);
              local_4c8 = (void *)((long)local_4c8 + 1);
              local_4d8 = (void *)((long)local_4d8 + 1);
              local_510 = (void *)((long)local_510 + 1);
              local_518 = (void *)((long)local_518 + 1);
              local_528 = (void *)((long)local_528 + 1);
              pvVar79 = (void *)((long)pvVar79 + 1);
              pvVar84 = (void *)((long)pvVar84 + 1);
              puVar47 = puVar47 + 2;
            } while ((int)(iVar22 + uVar57) < num_output);
          }
          local_428 = puVar70 + 8;
          puVar71 = (undefined8 *)((long)pvVar6 + uVar81 * 4 + lVar67);
          uVar17 = puVar71[1];
          *local_428 = *puVar71;
          puVar70[9] = uVar17;
          auVar96._16_16_ = *(undefined1 (*) [16])((long)pvVar7 + uVar81 * 4 + lVar53 * 4 + lVar45);
          auVar96._0_16_ = *(undefined1 (*) [16])((long)pvVar7 + uVar81 * 4 + lVar35 * 4 + lVar45);
          auVar97._16_16_ = *(undefined1 (*) [16])((long)pvVar8 + uVar81 * 4 + lVar53 * 4 + lVar77);
          auVar97._0_16_ = *(undefined1 (*) [16])((long)pvVar8 + uVar81 * 4 + lVar35 * 4 + lVar77);
          auVar94 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                    ((long)pvVar7 + uVar81 * 4 + lVar52 * 4 + lVar45
                                                    ),*(undefined1 (*) [16])
                                                       ((long)pvVar7 + uVar81 * 4 + lVar45))),
                               auVar96,1);
          auVar94 = vdivps_avx512f(auVar93,auVar94);
          auVar95 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                    ((long)pvVar8 + uVar81 * 4 + lVar52 * 4 + lVar77
                                                    ),*(undefined1 (*) [16])
                                                       ((long)pvVar8 + uVar81 * 4 + lVar77))),
                               auVar97,1);
          auVar95 = vdivps_avx512f(auVar93,auVar95);
          *(undefined1 (*) [64])((long)pvVar11 + lVar59 + lVar54) = auVar94;
          *(undefined1 (*) [64])((long)pvVar11 + lVar59 + lVar54 + 0x40) = auVar95;
          local_4f0 = (void *)(uVar81 + 4);
          lVar59 = uVar81 + 7;
          local_498 = (void *)((long)local_498 + lVar39);
          pvVar76 = (void *)((long)pvVar76 + lVar39);
          pvVar28 = (void *)((long)pvVar28 + lVar39);
          local_2f0 = (void *)((long)local_2f0 + lVar39);
          local_328 = (void *)((long)local_328 + lVar39);
          pvVar80 = (void *)((long)pvVar80 + lVar39);
          local_2f8 = (void *)((long)local_2f8 + lVar39);
          pvVar46 = (void *)((long)pvVar46 + lVar39);
          local_310 = (void *)((long)local_310 + lVar39);
          local_318 = (void *)((long)local_318 + lVar39);
          pvVar78 = (void *)((long)pvVar78 + lVar39);
          local_3b0 = (void *)((long)local_3b0 + lVar39);
          local_300 = (void *)((long)local_300 + lVar39);
          local_320 = (void *)((long)local_320 + lVar39);
          pvVar83 = (void *)((long)pvVar83 + lVar39);
          local_350 = (void *)((long)local_350 + lVar39);
          local_f8 = local_f8 + lVar39;
          local_100 = local_100 + lVar39;
          local_108 = local_108 + lVar39;
          local_110 = local_110 + lVar39;
          local_118 = local_118 + lVar39;
          local_3f0 = (void *)((long)local_3f0 + lVar55);
          pvVar61 = (void *)((long)pvVar61 + lVar55);
          local_490 = (void *)((long)local_490 + lVar55);
          local_400 = (void *)((long)local_400 + lVar55);
          pvVar56 = (void *)((long)pvVar56 + lVar55);
          pvVar48 = (void *)((long)pvVar48 + lVar55);
          local_3a8 = (void *)((long)local_3a8 + lVar55);
          local_420 = (void *)((long)local_420 + lVar55);
          local_480 = (void *)((long)local_480 + lVar55);
          local_3b8 = (void *)((long)local_3b8 + lVar55);
          local_330 = (void *)((long)local_330 + lVar55);
          local_338 = (void *)((long)local_338 + lVar55);
          local_2b0 = (void *)((long)local_2b0 + lVar55);
          local_2b8 = (void *)((long)local_2b8 + lVar55);
          local_340 = (void *)((long)local_340 + lVar55);
          local_348 = (void *)((long)local_348 + lVar55);
          local_120 = local_120 + lVar55;
          local_128 = local_128 + lVar55;
          local_130 = local_130 + lVar55;
          local_138 = local_138 + lVar55;
          local_140 = local_140 + lVar55;
          puVar70 = local_428;
          uVar81 = (ulong)local_4f0;
        } while (lVar59 < lVar52);
      }
      if ((int)((uint)local_4f0 | 1) < (int)_w) {
        lVar27 = sVar3 * lVar68;
        lVar59 = sVar4 * lVar37;
        uVar81 = (ulong)local_4f0 & 0xffffffff;
        lVar55 = lVar53 + 1 + uVar81;
        lVar62 = (lVar55 * lVar68 + lVar50) * sVar3;
        lVar63 = ((lVar53 + uVar81) * lVar68 + lVar50) * sVar3;
        lVar26 = lVar35 + 1 + uVar81;
        lVar69 = (lVar26 * lVar68 + lVar50) * sVar3;
        lVar34 = ((lVar35 + uVar81) * lVar68 + lVar50) * sVar3;
        lVar40 = lVar52 + 1 + uVar81;
        local_458 = (void *)((lVar40 * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        local_4a0 = (void *)(((lVar52 + uVar81) * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        lVar39 = uVar81 + 1;
        local_488 = (void *)((lVar39 * lVar68 + lVar50) * sVar3 + (long)pvVar49);
        lVar73 = (lVar68 * uVar81 + lVar50) * sVar3;
        bVar20 = 0;
        local_420 = (void *)(lVar73 + (long)pvVar49);
        local_3e8 = (long)pvVar49 + lVar73 + 1;
        local_3f8 = (void *)((long)pvVar49 + lVar34);
        local_3f0 = (void *)((long)pvVar49 + lVar34 + 1);
        local_498 = (void *)((long)pvVar49 + lVar63);
        local_380 = (long)pvVar49 + lVar63 + 1;
        pvVar76 = (void *)((long)pvVar49 + lVar69);
        local_388 = (long)pvVar49 + lVar69 + 1;
        local_500 = (void *)((long)pvVar49 + lVar62);
        local_390 = (long)pvVar49 + lVar62 + 1;
        lVar55 = (lVar55 * lVar37 + lVar25) * sVar4;
        lVar62 = ((lVar53 + uVar81) * lVar37 + lVar25) * sVar4;
        lVar69 = (lVar26 * lVar37 + lVar25) * sVar4;
        lVar26 = ((lVar35 + uVar81) * lVar37 + lVar25) * sVar4;
        pvVar61 = (void *)((lVar40 * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        pvVar48 = (void *)(((lVar52 + uVar81) * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        local_3c0 = (void *)((lVar39 * lVar37 + lVar25) * sVar4 + (long)pvVar12);
        lVar63 = (lVar37 * uVar81 + lVar25) * sVar4;
        pvVar80 = (void *)((long)pvVar12 + lVar63);
        local_398 = (long)pvVar12 + lVar63 + 1;
        local_490 = (void *)((long)pvVar12 + lVar26);
        local_3a0 = (long)pvVar12 + lVar26 + 1;
        local_480 = (void *)((long)pvVar12 + lVar62);
        local_250 = (long)pvVar12 + lVar62 + 1;
        local_470 = (void *)((long)pvVar12 + lVar69);
        local_258 = (long)pvVar12 + lVar69 + 1;
        local_478 = (void *)((long)pvVar12 + lVar55);
        local_260 = (long)pvVar12 + lVar55 + 1;
        lVar55 = lVar27 * 2;
        lVar26 = lVar59 * 2;
        do {
          uVar30 = (ulong)(((uint)(uVar81 >> 2) & 0x3fffffff) + (uint)(((uint)uVar81 >> 1 & 1) != 0)
                          );
          puVar70 = (undefined8 *)((long)pvVar9 + sVar10 * lVar38 * uVar30 + lVar89);
          uVar29 = 0;
          *(undefined4 *)local_428 = *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar67);
          *(undefined4 *)((long)local_428 + 4) = *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar19)
          ;
          *(undefined4 *)(local_428 + 1) = *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar36);
          *(undefined4 *)((long)local_428 + 0xc) =
               *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar18);
          *(undefined4 *)(local_428 + 2) = *(undefined4 *)((long)pvVar6 + lVar39 * 4 + lVar67);
          *(undefined4 *)((long)local_428 + 0x14) =
               *(undefined4 *)((long)pvVar6 + lVar39 * 4 + lVar19);
          *(undefined4 *)(local_428 + 3) = *(undefined4 *)((long)pvVar6 + lVar39 * 4 + lVar36);
          *(undefined4 *)((long)local_428 + 0x1c) =
               *(undefined4 *)((long)pvVar6 + lVar39 * 4 + lVar18);
          if (0x1f < iVar16) {
            lVar63 = 7;
            do {
              puVar71 = puVar70;
              puVar70 = (undefined8 *)
                        ((long)pvVar9 +
                        lVar63 * 8 +
                        ((ulong)((bVar20 & 1) + ((uint)((ulong)local_4f0 >> 2) & 0x3fffffff)) *
                         lVar38 + lVar88) * sVar10);
              puVar70[-7] = *(undefined8 *)((long)local_420 + lVar63 + -7);
              puVar70[-6] = *(undefined8 *)((long)local_488 + lVar63 + -7);
              puVar70[-5] = *(undefined8 *)((long)local_4a0 + lVar63 + -7);
              puVar70[-4] = *(undefined8 *)((long)local_458 + lVar63 + -7);
              puVar70[-3] = *(undefined8 *)((long)local_3f8 + lVar63 + -7);
              puVar70[-2] = *(undefined8 *)((long)pvVar76 + lVar63 + -7);
              puVar70[-1] = *(undefined8 *)((long)local_498 + lVar63 + -7);
              *puVar70 = *(undefined8 *)((long)local_500 + lVar63 + -7);
              lVar63 = lVar63 + 8;
              puVar70 = puVar70 + 1;
            } while (lVar63 < lVar82);
            puVar70 = puVar71 + 8;
            uVar29 = (ulong)((int)lVar63 - 7);
          }
          uVar57 = (uint)uVar29;
          if ((int)(uVar57 | 3) < iVar21) {
            lVar63 = local_3e8 + uVar29;
            lVar62 = (long)local_3f0 + uVar29;
            lVar40 = local_380 + uVar29;
            lVar69 = local_388 + uVar29;
            lVar34 = local_390 + uVar29;
            lVar74 = 0;
            lVar73 = 0;
            do {
              *(undefined1 *)(puVar70 + lVar73) = *(undefined1 *)(lVar63 + -1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 1) = *(undefined1 *)(lVar63 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 2) = *(undefined1 *)(lVar63 + 1 + lVar73)
              ;
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 3) = *(undefined1 *)(lVar63 + 2 + lVar73)
              ;
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 4) =
                   *(undefined1 *)((long)local_4a0 + lVar73 + uVar29);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 5) =
                   *(undefined1 *)((long)local_4a0 + lVar73 + uVar29 + 1);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 6) =
                   *(undefined1 *)((long)local_4a0 + lVar73 + uVar29 + 2);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 7) =
                   *(undefined1 *)((long)local_4a0 + lVar73 + uVar29 + 3);
              *(undefined1 *)(puVar70 + lVar73 + 1) =
                   *(undefined1 *)((long)local_488 + lVar73 + uVar29);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 9) =
                   *(undefined1 *)((long)local_488 + lVar73 + uVar29 + 1);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 10) =
                   *(undefined1 *)((long)local_488 + lVar73 + uVar29 + 2);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0xb) =
                   *(undefined1 *)((long)local_488 + lVar73 + uVar29 + 3);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0xc) =
                   *(undefined1 *)((long)local_458 + lVar73 + uVar29);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0xd) =
                   *(undefined1 *)((long)local_458 + lVar73 + uVar29 + 1);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0xe) =
                   *(undefined1 *)((long)local_458 + lVar73 + uVar29 + 2);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0xf) =
                   *(undefined1 *)((long)local_458 + lVar73 + uVar29 + 3);
              *(undefined1 *)(puVar70 + lVar73 + 2) = *(undefined1 *)(lVar62 + -1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x11) = *(undefined1 *)(lVar62 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x12) =
                   *(undefined1 *)(lVar62 + 1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x13) =
                   *(undefined1 *)(lVar62 + 2 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x14) =
                   *(undefined1 *)(lVar40 + -1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x15) = *(undefined1 *)(lVar40 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x16) =
                   *(undefined1 *)(lVar40 + 1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x17) =
                   *(undefined1 *)(lVar40 + 2 + lVar73);
              *(undefined1 *)(puVar70 + lVar73 + 3) = *(undefined1 *)(lVar69 + -1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x19) = *(undefined1 *)(lVar69 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x1a) =
                   *(undefined1 *)(lVar69 + 1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x1b) =
                   *(undefined1 *)(lVar69 + 2 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x1c) =
                   *(undefined1 *)(lVar34 + -1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x1d) = *(undefined1 *)(lVar34 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x1e) =
                   *(undefined1 *)(lVar34 + 1 + lVar73);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 0x1f) =
                   *(undefined1 *)(lVar34 + 2 + lVar73);
              iVar22 = (int)lVar73;
              lVar73 = lVar73 + 4;
              lVar74 = lVar74 + 0x20;
            } while ((int)(uVar57 + iVar22 + 4 | 3) < iVar21);
            uVar29 = (ulong)(uVar57 + (int)lVar73);
            puVar70 = (undefined8 *)((long)puVar70 + lVar74);
          }
          lVar63 = uVar81 + lVar52;
          lVar62 = uVar81 + lVar35;
          lVar69 = uVar81 + lVar53;
          lVar34 = uVar81 + 1 + lVar52;
          lVar40 = uVar81 + 1 + lVar35;
          lVar73 = uVar81 + lVar53 + 1;
          uVar57 = (uint)uVar29;
          uVar72 = uVar57 | 1;
          if ((int)uVar72 < iVar21) {
            lVar74 = 0;
            puVar71 = puVar70;
            do {
              puVar47 = puVar71;
              puVar71 = puVar70 + lVar74;
              *(undefined1 *)puVar71 = *(undefined1 *)((long)local_420 + lVar74 + uVar29);
              uVar43 = (ulong)uVar72;
              *(undefined1 *)((long)puVar71 + 1) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + uVar81 * lVar27);
              *(undefined1 *)((long)puVar71 + 2) =
                   *(undefined1 *)((long)local_4a0 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 3) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar63 * lVar27);
              *(undefined1 *)((long)puVar71 + 4) =
                   *(undefined1 *)((long)local_3f8 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 5) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar62 * lVar27);
              *(undefined1 *)((long)puVar71 + 6) =
                   *(undefined1 *)((long)local_498 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 7) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar69 * lVar27);
              *(undefined1 *)(puVar71 + 1) = *(undefined1 *)((long)local_488 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 9) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar39 * lVar27);
              *(undefined1 *)((long)puVar71 + 10) =
                   *(undefined1 *)((long)local_458 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 0xb) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar34 * lVar27);
              *(undefined1 *)((long)puVar71 + 0xc) =
                   *(undefined1 *)((long)pvVar76 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 0xd) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar40 * lVar27);
              *(undefined1 *)((long)puVar71 + 0xe) =
                   *(undefined1 *)((long)local_500 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 0xf) =
                   *(undefined1 *)((long)pvVar14 + uVar43 + lVar73 * lVar27);
              uVar72 = uVar57 + (int)lVar74 + 2 | 1;
              lVar74 = lVar74 + 2;
              puVar71 = puVar71 + 2;
            } while ((int)uVar72 < iVar21);
            puVar70 = puVar47 + 2;
            uVar29 = (ulong)(uVar57 + (int)lVar74);
          }
          if ((int)uVar29 < iVar21) {
            lVar74 = 0;
            puVar71 = puVar70;
            do {
              puVar47 = puVar71;
              puVar71 = puVar70 + lVar74;
              *(undefined1 *)puVar71 = *(undefined1 *)((long)local_420 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 1) =
                   *(undefined1 *)((long)local_4a0 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 2) =
                   *(undefined1 *)((long)local_3f8 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 3) =
                   *(undefined1 *)((long)local_498 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 4) =
                   *(undefined1 *)((long)local_488 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 5) =
                   *(undefined1 *)((long)local_458 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 6) = *(undefined1 *)((long)pvVar76 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 7) =
                   *(undefined1 *)((long)local_500 + lVar74 + uVar29);
              lVar74 = lVar74 + 1;
              puVar71 = puVar71 + 1;
            } while ((int)lVar74 + (int)uVar29 < iVar21);
            puVar70 = puVar47 + 1;
          }
          uVar57 = 0;
          if (7 < num_output) {
            lVar74 = 7;
            puVar71 = puVar70;
            do {
              puVar47 = puVar71;
              puVar71 = puVar70 + lVar74;
              puVar71[-7] = *(undefined8 *)((long)pvVar80 + lVar74 + -7);
              puVar71[-6] = *(undefined8 *)((long)local_3c0 + lVar74 + -7);
              puVar71[-5] = *(undefined8 *)((long)pvVar48 + lVar74 + -7);
              puVar71[-4] = *(undefined8 *)((long)pvVar61 + lVar74 + -7);
              puVar71[-3] = *(undefined8 *)((long)local_490 + lVar74 + -7);
              puVar71[-2] = *(undefined8 *)((long)local_470 + lVar74 + -7);
              puVar71[-1] = *(undefined8 *)((long)local_480 + lVar74 + -7);
              *puVar71 = *(undefined8 *)((long)local_478 + lVar74 + -7);
              lVar74 = lVar74 + 8;
              puVar71 = puVar71 + 1;
            } while (lVar74 < lVar23);
            puVar70 = puVar47 + 8;
            uVar57 = (int)lVar74 - 7;
          }
          if ((int)(uVar57 | 3) < num_output) {
            uVar29 = (ulong)uVar57;
            lVar74 = local_398 + uVar29;
            lVar75 = local_3a0 + uVar29;
            lVar60 = local_250 + uVar29;
            lVar1 = local_258 + uVar29;
            lVar2 = local_260 + uVar29;
            lVar41 = 0;
            lVar31 = 0;
            do {
              *(undefined1 *)(puVar70 + lVar31) = *(undefined1 *)(lVar74 + -1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 1) = *(undefined1 *)(lVar74 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 2) = *(undefined1 *)(lVar74 + 1 + lVar31)
              ;
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 3) = *(undefined1 *)(lVar74 + 2 + lVar31)
              ;
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 4) =
                   *(undefined1 *)((long)pvVar48 + lVar31 + uVar29);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 5) =
                   *(undefined1 *)((long)pvVar48 + lVar31 + uVar29 + 1);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 6) =
                   *(undefined1 *)((long)pvVar48 + lVar31 + uVar29 + 2);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 7) =
                   *(undefined1 *)((long)pvVar48 + lVar31 + uVar29 + 3);
              *(undefined1 *)(puVar70 + lVar31 + 1) =
                   *(undefined1 *)((long)local_3c0 + lVar31 + uVar29);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 9) =
                   *(undefined1 *)((long)local_3c0 + lVar31 + uVar29 + 1);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 10) =
                   *(undefined1 *)((long)local_3c0 + lVar31 + uVar29 + 2);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0xb) =
                   *(undefined1 *)((long)local_3c0 + lVar31 + uVar29 + 3);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0xc) =
                   *(undefined1 *)((long)pvVar61 + lVar31 + uVar29);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0xd) =
                   *(undefined1 *)((long)pvVar61 + lVar31 + uVar29 + 1);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0xe) =
                   *(undefined1 *)((long)pvVar61 + lVar31 + uVar29 + 2);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0xf) =
                   *(undefined1 *)((long)pvVar61 + lVar31 + uVar29 + 3);
              *(undefined1 *)(puVar70 + lVar31 + 2) = *(undefined1 *)(lVar75 + -1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x11) = *(undefined1 *)(lVar75 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x12) =
                   *(undefined1 *)(lVar75 + 1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x13) =
                   *(undefined1 *)(lVar75 + 2 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x14) =
                   *(undefined1 *)(lVar60 + -1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x15) = *(undefined1 *)(lVar60 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x16) =
                   *(undefined1 *)(lVar60 + 1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x17) =
                   *(undefined1 *)(lVar60 + 2 + lVar31);
              *(undefined1 *)(puVar70 + lVar31 + 3) = *(undefined1 *)(lVar1 + -1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x19) = *(undefined1 *)(lVar1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x1a) =
                   *(undefined1 *)(lVar1 + 1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x1b) =
                   *(undefined1 *)(lVar1 + 2 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x1c) =
                   *(undefined1 *)(lVar2 + -1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x1d) = *(undefined1 *)(lVar2 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x1e) =
                   *(undefined1 *)(lVar2 + 1 + lVar31);
              *(undefined1 *)((long)puVar70 + lVar31 * 8 + 0x1f) =
                   *(undefined1 *)(lVar2 + 2 + lVar31);
              iVar22 = (int)lVar31;
              lVar31 = lVar31 + 4;
              lVar41 = lVar41 + 0x20;
            } while ((int)(uVar57 + iVar22 + 4 | 3) < num_output);
            uVar57 = uVar57 + (int)lVar31;
            puVar70 = (undefined8 *)((long)puVar70 + lVar41);
          }
          uVar72 = uVar57 | 1;
          if ((int)uVar72 < num_output) {
            uVar29 = (ulong)uVar57;
            lVar74 = 0;
            puVar71 = puVar70;
            do {
              puVar47 = puVar71;
              puVar71 = puVar70 + lVar74;
              *(undefined1 *)puVar71 = *(undefined1 *)((long)pvVar80 + lVar74 + uVar29);
              uVar43 = (ulong)uVar72;
              *(undefined1 *)((long)puVar71 + 1) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + uVar81 * lVar59);
              *(undefined1 *)((long)puVar71 + 2) = *(undefined1 *)((long)pvVar48 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 3) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar63 * lVar59);
              *(undefined1 *)((long)puVar71 + 4) =
                   *(undefined1 *)((long)local_490 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 5) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar62 * lVar59);
              *(undefined1 *)((long)puVar71 + 6) =
                   *(undefined1 *)((long)local_480 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 7) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar69 * lVar59);
              *(undefined1 *)(puVar71 + 1) = *(undefined1 *)((long)local_3c0 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 9) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar39 * lVar59);
              *(undefined1 *)((long)puVar71 + 10) = *(undefined1 *)((long)pvVar61 + lVar74 + uVar29)
              ;
              *(undefined1 *)((long)puVar71 + 0xb) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar34 * lVar59);
              *(undefined1 *)((long)puVar71 + 0xc) =
                   *(undefined1 *)((long)local_470 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 0xd) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar40 * lVar59);
              *(undefined1 *)((long)puVar71 + 0xe) =
                   *(undefined1 *)((long)local_478 + lVar74 + uVar29);
              *(undefined1 *)((long)puVar71 + 0xf) =
                   *(undefined1 *)((long)pvVar86 + uVar43 + lVar73 * lVar59);
              uVar72 = uVar57 + (int)lVar74 + 2 | 1;
              lVar74 = lVar74 + 2;
              puVar71 = puVar71 + 2;
            } while ((int)uVar72 < num_output);
            puVar70 = puVar47 + 2;
            uVar57 = uVar57 + (int)lVar74;
          }
          lVar34 = uVar30 * sVar5 * lVar58;
          if ((int)uVar57 < num_output) {
            uVar30 = (ulong)uVar57;
            lVar73 = 0;
            do {
              *(undefined1 *)(puVar70 + lVar73) = *(undefined1 *)((long)pvVar80 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 1) =
                   *(undefined1 *)((long)pvVar48 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 2) =
                   *(undefined1 *)((long)local_490 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 3) =
                   *(undefined1 *)((long)local_480 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 4) =
                   *(undefined1 *)((long)local_3c0 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 5) =
                   *(undefined1 *)((long)pvVar61 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 6) =
                   *(undefined1 *)((long)local_470 + lVar73 + uVar30);
              *(undefined1 *)((long)puVar70 + lVar73 * 8 + 7) =
                   *(undefined1 *)((long)local_478 + lVar73 + uVar30);
              lVar73 = lVar73 + 1;
            } while ((int)((int)lVar73 + uVar57) < num_output);
          }
          *(float *)((long)pvVar11 + lVar34 + lVar54) =
               1.0 / *(float *)((long)pvVar7 + uVar81 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 4) =
               1.0 / *(float *)((long)pvVar7 + lVar63 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 8) =
               1.0 / *(float *)((long)pvVar7 + lVar62 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0xc) =
               1.0 / *(float *)((long)pvVar7 + lVar69 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x10) =
               1.0 / *(float *)((long)pvVar7 + lVar39 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x14) =
               1.0 / *(float *)((long)pvVar7 + lVar63 * 4 + lVar45 + 4);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x18) =
               1.0 / *(float *)((long)pvVar7 + lVar40 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x1c) =
               1.0 / *(float *)((long)pvVar7 + lVar69 * 4 + lVar45 + 4);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x20) =
               1.0 / *(float *)((long)pvVar8 + uVar81 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x24) =
               1.0 / *(float *)((long)pvVar8 + lVar63 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x28) =
               1.0 / *(float *)((long)pvVar8 + lVar62 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x2c) =
               1.0 / *(float *)((long)pvVar8 + lVar69 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x30) =
               1.0 / *(float *)((long)pvVar8 + lVar39 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x34) =
               1.0 / *(float *)((long)pvVar8 + lVar63 * 4 + lVar77 + 4);
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x38) =
               1.0 / *(float *)((long)pvVar8 + lVar40 * 4 + lVar77);
          local_428 = local_428 + 4;
          *(float *)((long)pvVar11 + lVar34 + lVar54 + 0x3c) =
               1.0 / *(float *)((long)pvVar8 + lVar69 * 4 + lVar77 + 4);
          uVar30 = uVar81 + 2;
          lVar63 = uVar81 + 3;
          lVar39 = lVar39 + 2;
          local_500 = (void *)((long)local_500 + lVar55);
          local_498 = (void *)((long)local_498 + lVar55);
          pvVar76 = (void *)((long)pvVar76 + lVar55);
          local_3f8 = (void *)((long)local_3f8 + lVar55);
          local_458 = (void *)((long)local_458 + lVar55);
          local_4a0 = (void *)((long)local_4a0 + lVar55);
          local_488 = (void *)((long)local_488 + lVar55);
          local_420 = (void *)((long)local_420 + lVar55);
          local_4f0 = (void *)(ulong)((int)local_4f0 + 2);
          bVar20 = bVar20 + 1;
          local_3e8 = local_3e8 + lVar55;
          local_3f0 = (void *)((long)local_3f0 + lVar55);
          local_380 = local_380 + lVar55;
          local_388 = local_388 + lVar55;
          local_390 = local_390 + lVar55;
          local_478 = (void *)((long)local_478 + lVar26);
          local_480 = (void *)((long)local_480 + lVar26);
          local_470 = (void *)((long)local_470 + lVar26);
          local_490 = (void *)((long)local_490 + lVar26);
          pvVar61 = (void *)((long)pvVar61 + lVar26);
          pvVar48 = (void *)((long)pvVar48 + lVar26);
          local_3c0 = (void *)((long)local_3c0 + lVar26);
          pvVar80 = (void *)((long)pvVar80 + lVar26);
          local_398 = local_398 + lVar26;
          local_3a0 = local_3a0 + lVar26;
          local_250 = local_250 + lVar26;
          local_258 = local_258 + lVar26;
          local_260 = local_260 + lVar26;
          uVar81 = uVar30;
        } while (lVar63 < lVar52);
        local_4f0 = (void *)(uVar30 & 0xffffffff);
      }
      if ((int)local_4f0 < (int)_w) {
        lVar39 = sVar3 * lVar68;
        uVar81 = (ulong)local_4f0 & 0xffffffff;
        lVar55 = ((lVar53 + uVar81) * lVar68 + lVar50) * sVar3;
        lVar26 = ((lVar35 + uVar81) * lVar68 + lVar50) * sVar3;
        lVar59 = ((lVar52 + uVar81) * lVar68 + lVar50) * sVar3;
        lVar50 = (lVar68 * uVar81 + lVar50) * sVar3;
        pvVar80 = (void *)(lVar50 + (long)pvVar49);
        lVar27 = (long)pvVar49 + lVar50 + 1;
        pvVar76 = (void *)((long)pvVar49 + lVar59);
        local_498 = (void *)((long)pvVar49 + lVar59 + 1);
        pvVar48 = (void *)((long)pvVar49 + lVar26);
        local_490 = (void *)((long)pvVar49 + lVar26 + 1);
        pvVar61 = (void *)((long)pvVar49 + lVar55);
        local_480 = (void *)((long)pvVar49 + lVar55 + 1);
        lVar55 = sVar4 * lVar37;
        lVar50 = ((lVar53 + uVar81) * lVar37 + lVar25) * sVar4;
        lVar68 = ((lVar35 + uVar81) * lVar37 + lVar25) * sVar4;
        lVar26 = ((lVar52 + uVar81) * lVar37 + lVar25) * sVar4;
        lVar25 = (lVar37 * uVar81 + lVar25) * sVar4;
        local_500 = (void *)((long)pvVar12 + lVar25);
        local_478 = (void *)((long)pvVar12 + lVar25 + 1);
        pvVar49 = (void *)((long)pvVar12 + lVar26);
        local_450 = (long)pvVar12 + lVar26 + 1;
        local_528 = (void *)((long)pvVar12 + lVar68);
        local_430 = (long)pvVar12 + lVar68 + 1;
        local_510 = (void *)((long)pvVar12 + lVar50);
        local_438 = (long)pvVar12 + lVar50 + 1;
        do {
          uVar57 = (uint)local_4f0;
          uVar29 = (ulong)(((uint)uVar81 & 1) + ((uint)(uVar81 >> 2) & 0x3fffffff) +
                          (uint)(((uint)uVar81 >> 1 & 1) != 0));
          puVar64 = (undefined1 *)((long)pvVar9 + sVar10 * lVar38 * uVar29 + lVar89);
          uVar30 = 0;
          *(undefined4 *)local_428 = *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar67);
          *(undefined4 *)((long)local_428 + 4) = *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar19)
          ;
          *(undefined4 *)(local_428 + 1) = *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar36);
          *(undefined4 *)((long)local_428 + 0xc) =
               *(undefined4 *)((long)pvVar6 + uVar81 * 4 + lVar18);
          if (0x1f < iVar16) {
            lVar25 = 7;
            do {
              puVar65 = puVar64;
              puVar64 = (undefined1 *)
                        ((long)pvVar9 +
                        lVar25 * 4 + 4 +
                        ((ulong)((uVar57 & 1) + ((uint)((ulong)local_4f0 >> 2) & 0x3fffffff) +
                                (uint)((uVar57 >> 1 & 1) != 0)) * lVar38 + lVar88) * sVar10);
              *(undefined8 *)(puVar64 + -0x20) = *(undefined8 *)((long)pvVar80 + lVar25 + -7);
              *(undefined8 *)(puVar64 + -0x18) = *(undefined8 *)((long)pvVar76 + lVar25 + -7);
              *(undefined8 *)(puVar64 + -0x10) = *(undefined8 *)((long)pvVar48 + lVar25 + -7);
              *(undefined8 *)(puVar64 + -8) = *(undefined8 *)((long)pvVar61 + lVar25 + -7);
              lVar25 = lVar25 + 8;
            } while (lVar25 < lVar82);
            puVar64 = puVar65 + 0x20;
            uVar30 = (ulong)((int)lVar25 - 7);
          }
          uVar72 = (uint)uVar30;
          if ((int)(uVar72 | 3) < iVar21) {
            lVar25 = lVar27 + uVar30;
            lVar37 = (long)local_498 + uVar30;
            lVar50 = (long)local_490 + uVar30;
            lVar68 = (long)local_480 + uVar30;
            lVar59 = 0;
            lVar26 = 0;
            do {
              puVar64[lVar26 * 4] = *(undefined1 *)(lVar25 + -1 + lVar26);
              puVar64[lVar26 * 4 + 1] = *(undefined1 *)(lVar25 + lVar26);
              puVar64[lVar26 * 4 + 2] = *(undefined1 *)(lVar25 + 1 + lVar26);
              puVar64[lVar26 * 4 + 3] = *(undefined1 *)(lVar25 + 2 + lVar26);
              puVar64[lVar26 * 4 + 4] = *(undefined1 *)(lVar37 + -1 + lVar26);
              puVar64[lVar26 * 4 + 5] = *(undefined1 *)(lVar37 + lVar26);
              puVar64[lVar26 * 4 + 6] = *(undefined1 *)(lVar37 + 1 + lVar26);
              puVar64[lVar26 * 4 + 7] = *(undefined1 *)(lVar37 + 2 + lVar26);
              puVar64[lVar26 * 4 + 8] = *(undefined1 *)(lVar50 + -1 + lVar26);
              puVar64[lVar26 * 4 + 9] = *(undefined1 *)(lVar50 + lVar26);
              puVar64[lVar26 * 4 + 10] = *(undefined1 *)(lVar50 + 1 + lVar26);
              puVar64[lVar26 * 4 + 0xb] = *(undefined1 *)(lVar50 + 2 + lVar26);
              puVar64[lVar26 * 4 + 0xc] = *(undefined1 *)(lVar68 + -1 + lVar26);
              puVar64[lVar26 * 4 + 0xd] = *(undefined1 *)(lVar68 + lVar26);
              puVar64[lVar26 * 4 + 0xe] = *(undefined1 *)(lVar68 + 1 + lVar26);
              puVar64[lVar26 * 4 + 0xf] = *(undefined1 *)(lVar68 + 2 + lVar26);
              iVar22 = (int)lVar26;
              lVar26 = lVar26 + 4;
              lVar59 = lVar59 + 0x10;
            } while ((int)(uVar72 + iVar22 + 4 | 3) < iVar21);
            uVar30 = (ulong)(uVar72 + (int)lVar26);
            puVar64 = puVar64 + lVar59;
          }
          lVar25 = uVar81 + lVar52;
          lVar37 = uVar81 + lVar35;
          lVar50 = uVar81 + lVar53;
          uVar72 = (uint)uVar30;
          uVar44 = uVar72 | 1;
          if ((int)uVar44 < iVar21) {
            lVar68 = 0;
            puVar65 = puVar64;
            do {
              puVar42 = puVar65;
              puVar65 = puVar64 + lVar68 * 4;
              *puVar65 = *(undefined1 *)((long)pvVar80 + lVar68 + uVar30);
              uVar43 = (ulong)uVar44;
              puVar65[1] = *(undefined1 *)((long)pvVar14 + uVar43 + uVar81 * lVar39);
              puVar65[2] = *(undefined1 *)((long)pvVar76 + lVar68 + uVar30);
              puVar65[3] = *(undefined1 *)((long)pvVar14 + uVar43 + lVar25 * lVar39);
              puVar65[4] = *(undefined1 *)((long)pvVar48 + lVar68 + uVar30);
              puVar65[5] = *(undefined1 *)((long)pvVar14 + uVar43 + lVar37 * lVar39);
              puVar65[6] = *(undefined1 *)((long)pvVar61 + lVar68 + uVar30);
              puVar65[7] = *(undefined1 *)((long)pvVar14 + uVar43 + lVar50 * lVar39);
              uVar44 = uVar72 + (int)lVar68 + 2 | 1;
              lVar68 = lVar68 + 2;
              puVar65 = puVar65 + 8;
            } while ((int)uVar44 < iVar21);
            puVar64 = puVar42 + 8;
            uVar30 = (ulong)(uVar72 + (int)lVar68);
          }
          if ((int)uVar30 < iVar21) {
            lVar68 = 0;
            puVar65 = puVar64;
            do {
              puVar42 = puVar65;
              puVar65 = puVar64 + lVar68 * 4;
              *puVar65 = *(undefined1 *)((long)pvVar80 + lVar68 + uVar30);
              puVar65[1] = *(undefined1 *)((long)pvVar76 + lVar68 + uVar30);
              puVar65[2] = *(undefined1 *)((long)pvVar48 + lVar68 + uVar30);
              puVar65[3] = *(undefined1 *)((long)pvVar61 + lVar68 + uVar30);
              lVar68 = lVar68 + 1;
              puVar65 = puVar65 + 4;
            } while ((int)lVar68 + (int)uVar30 < iVar21);
            puVar64 = puVar42 + 4;
          }
          uVar72 = 0;
          if (7 < num_output) {
            lVar68 = 7;
            puVar65 = puVar64;
            do {
              puVar42 = puVar65;
              lVar26 = lVar68 * 4;
              *(undefined8 *)(puVar64 + lVar68 * 4 + -0x1c) =
                   *(undefined8 *)((long)local_500 + lVar68 + -7);
              *(undefined8 *)(puVar64 + lVar68 * 4 + -0x14) =
                   *(undefined8 *)((long)pvVar49 + lVar68 + -7);
              *(undefined8 *)(puVar64 + lVar68 * 4 + -0xc) =
                   *(undefined8 *)((long)local_528 + lVar68 + -7);
              *(undefined8 *)(puVar64 + lVar68 * 4 + -4) =
                   *(undefined8 *)((long)local_510 + lVar68 + -7);
              lVar68 = lVar68 + 8;
              puVar65 = puVar64 + lVar26 + 4;
            } while (lVar68 < lVar23);
            puVar64 = puVar42 + 0x20;
            uVar72 = (int)lVar68 - 7;
          }
          if ((int)(uVar72 | 3) < num_output) {
            uVar30 = (ulong)uVar72;
            lVar68 = (long)local_478 + uVar30;
            lVar26 = local_450 + uVar30;
            lVar59 = local_430 + uVar30;
            lVar63 = local_438 + uVar30;
            lVar69 = 0;
            lVar62 = 0;
            do {
              puVar64[lVar62 * 4] = *(undefined1 *)(lVar68 + -1 + lVar62);
              puVar64[lVar62 * 4 + 1] = *(undefined1 *)(lVar68 + lVar62);
              puVar64[lVar62 * 4 + 2] = *(undefined1 *)(lVar68 + 1 + lVar62);
              puVar64[lVar62 * 4 + 3] = *(undefined1 *)(lVar68 + 2 + lVar62);
              puVar64[lVar62 * 4 + 4] = *(undefined1 *)(lVar26 + -1 + lVar62);
              puVar64[lVar62 * 4 + 5] = *(undefined1 *)(lVar26 + lVar62);
              puVar64[lVar62 * 4 + 6] = *(undefined1 *)(lVar26 + 1 + lVar62);
              puVar64[lVar62 * 4 + 7] = *(undefined1 *)(lVar26 + 2 + lVar62);
              puVar64[lVar62 * 4 + 8] = *(undefined1 *)(lVar59 + -1 + lVar62);
              puVar64[lVar62 * 4 + 9] = *(undefined1 *)(lVar59 + lVar62);
              puVar64[lVar62 * 4 + 10] = *(undefined1 *)(lVar59 + 1 + lVar62);
              puVar64[lVar62 * 4 + 0xb] = *(undefined1 *)(lVar59 + 2 + lVar62);
              puVar64[lVar62 * 4 + 0xc] = *(undefined1 *)(lVar63 + -1 + lVar62);
              puVar64[lVar62 * 4 + 0xd] = *(undefined1 *)(lVar63 + lVar62);
              puVar64[lVar62 * 4 + 0xe] = *(undefined1 *)(lVar63 + 1 + lVar62);
              puVar64[lVar62 * 4 + 0xf] = *(undefined1 *)(lVar63 + 2 + lVar62);
              iVar22 = (int)lVar62;
              lVar62 = lVar62 + 4;
              lVar69 = lVar69 + 0x10;
            } while ((int)(uVar72 + iVar22 + 4 | 3) < num_output);
            uVar72 = uVar72 + (int)lVar62;
            puVar64 = puVar64 + lVar69;
          }
          uVar44 = uVar72 | 1;
          if ((int)uVar44 < num_output) {
            uVar30 = (ulong)uVar72;
            lVar68 = 0;
            puVar65 = puVar64;
            do {
              puVar42 = puVar65;
              puVar65 = puVar64 + lVar68 * 4;
              *puVar65 = *(undefined1 *)((long)local_500 + lVar68 + uVar30);
              uVar43 = (ulong)uVar44;
              puVar65[1] = *(undefined1 *)((long)pvVar86 + uVar43 + uVar81 * lVar55);
              puVar65[2] = *(undefined1 *)((long)pvVar49 + lVar68 + uVar30);
              puVar65[3] = *(undefined1 *)((long)pvVar86 + uVar43 + lVar25 * lVar55);
              puVar65[4] = *(undefined1 *)((long)local_528 + lVar68 + uVar30);
              puVar65[5] = *(undefined1 *)((long)pvVar86 + uVar43 + lVar37 * lVar55);
              puVar65[6] = *(undefined1 *)((long)local_510 + lVar68 + uVar30);
              puVar65[7] = *(undefined1 *)((long)pvVar86 + uVar43 + lVar50 * lVar55);
              uVar44 = uVar72 + (int)lVar68 + 2 | 1;
              lVar68 = lVar68 + 2;
              puVar65 = puVar65 + 8;
            } while ((int)uVar44 < num_output);
            puVar64 = puVar42 + 8;
            uVar72 = uVar72 + (int)lVar68;
          }
          if ((int)uVar72 < num_output) {
            uVar30 = (ulong)uVar72;
            lVar68 = 0;
            do {
              puVar64[lVar68 * 4] = *(undefined1 *)((long)local_500 + lVar68 + uVar30);
              puVar64[lVar68 * 4 + 1] = *(undefined1 *)((long)pvVar49 + lVar68 + uVar30);
              puVar64[lVar68 * 4 + 2] = *(undefined1 *)((long)local_528 + lVar68 + uVar30);
              puVar64[lVar68 * 4 + 3] = *(undefined1 *)((long)local_510 + lVar68 + uVar30);
              lVar68 = lVar68 + 1;
            } while ((int)((int)lVar68 + uVar72) < num_output);
          }
          lVar68 = uVar29 * sVar5 * lVar58;
          *(float *)((long)pvVar11 + lVar68 + lVar54) =
               1.0 / *(float *)((long)pvVar7 + uVar81 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 4) =
               1.0 / *(float *)((long)pvVar7 + lVar25 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 8) =
               1.0 / *(float *)((long)pvVar7 + lVar37 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 0xc) =
               1.0 / *(float *)((long)pvVar7 + lVar50 * 4 + lVar45);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 0x10) =
               1.0 / *(float *)((long)pvVar8 + uVar81 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 0x14) =
               1.0 / *(float *)((long)pvVar8 + lVar25 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 0x18) =
               1.0 / *(float *)((long)pvVar8 + lVar37 * 4 + lVar77);
          *(float *)((long)pvVar11 + lVar68 + lVar54 + 0x1c) =
               1.0 / *(float *)((long)pvVar8 + lVar50 * 4 + lVar77);
          local_428 = local_428 + 2;
          uVar81 = uVar81 + 1;
          pvVar61 = (void *)((long)pvVar61 + lVar39);
          pvVar48 = (void *)((long)pvVar48 + lVar39);
          pvVar76 = (void *)((long)pvVar76 + lVar39);
          pvVar80 = (void *)((long)pvVar80 + lVar39);
          local_4f0 = (void *)(ulong)(uVar57 + 1);
          lVar27 = lVar27 + lVar39;
          local_498 = (void *)((long)local_498 + lVar39);
          local_490 = (void *)((long)local_490 + lVar39);
          local_480 = (void *)((long)local_480 + lVar39);
          local_510 = (void *)((long)local_510 + lVar55);
          local_528 = (void *)((long)local_528 + lVar55);
          pvVar49 = (void *)((long)pvVar49 + lVar55);
          local_500 = (void *)((long)local_500 + lVar55);
          local_478 = (void *)((long)local_478 + lVar55);
          local_450 = local_450 + lVar55;
          local_430 = local_430 + lVar55;
          local_438 = local_438 + lVar55;
        } while (uVar81 != uVar32);
      }
      uVar66 = uVar66 + 1;
    } while (uVar66 != _c);
  }
  else {
    lstm_transform_weight_int8_avx512vnni
              (weight_xc,weight_xc_int8_scales,weight_hc,weight_hc_int8_scales,bias_c,
               &this->weight_data_tm,&this->weight_data_tm_int8_descales,&this->bias_c_data_packed,
               iVar21,num_output,_c,_w,opt);
  }
  if (opt->lightmode == true) {
    piVar13 = (this->super_LSTM).weight_xc_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->super_LSTM).weight_xc_data.data;
        pAVar15 = (this->super_LSTM).weight_xc_data.allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
    weight_xc->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data.dims = 0;
    (this->super_LSTM).weight_xc_data.w = 0;
    (this->super_LSTM).weight_xc_data.h = 0;
    (this->super_LSTM).weight_xc_data.d = 0;
    (this->super_LSTM).weight_xc_data.c = 0;
    piVar13 = (this->super_LSTM).bias_c_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->super_LSTM).bias_c_data.data;
        pAVar15 = (this->super_LSTM).bias_c_data.allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).bias_c_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
    bias_c->data = (void *)0x0;
    (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
    (this->super_LSTM).bias_c_data.dims = 0;
    (this->super_LSTM).bias_c_data.w = 0;
    (this->super_LSTM).bias_c_data.h = 0;
    (this->super_LSTM).bias_c_data.d = 0;
    (this->super_LSTM).bias_c_data.c = 0;
    piVar13 = (this->super_LSTM).weight_hc_data.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->super_LSTM).weight_hc_data.data;
        pAVar15 = (this->super_LSTM).weight_hc_data.allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
    weight_hc->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data.dims = 0;
    (this->super_LSTM).weight_hc_data.w = 0;
    (this->super_LSTM).weight_hc_data.h = 0;
    (this->super_LSTM).weight_hc_data.d = 0;
    (this->super_LSTM).weight_hc_data.c = 0;
    piVar13 = (this->super_LSTM).weight_xc_data_int8_scales.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->super_LSTM).weight_xc_data_int8_scales.data;
        pAVar15 = (this->super_LSTM).weight_xc_data_int8_scales.allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.elemsize + 4) = 0;
    weight_xc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.c = 0;
    piVar13 = (this->super_LSTM).weight_hc_data_int8_scales.refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        pvVar14 = (this->super_LSTM).weight_hc_data_int8_scales.data;
        pAVar15 = (this->super_LSTM).weight_hc_data_int8_scales.allocator;
        if (pAVar15 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(pvVar14);
          }
        }
        else {
          (*pAVar15->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.elemsize + 4) = 0;
    weight_hc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.c = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx512::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}